

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdir-posix.c
# Opt level: O3

pboolean p_dir_remove(pchar *path,PError **error)

{
  int iVar1;
  stat sb;
  stat sStack_a8;
  
  if (path == (pchar *)0x0) {
    p_dir_remove_cold_2();
  }
  else {
    iVar1 = stat(path,&sStack_a8);
    if ((iVar1 != 0) || ((sStack_a8.st_mode & 0xf000) != 0x4000)) {
      p_error_set_error_p(error,0x207,0,"Specified directory doesn\'t exist");
      return 0;
    }
    iVar1 = rmdir(path);
    if (iVar1 == 0) {
      return 1;
    }
    p_dir_remove_cold_1();
  }
  return 0;
}

Assistant:

P_LIB_API pboolean
p_dir_remove (const pchar	*path,
	      PError		**error)
{
	if (P_UNLIKELY (path == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (!p_dir_is_exists (path)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_NOT_EXISTS,
				     0,
				     "Specified directory doesn't exist");
		return FALSE;
	}

	if (P_UNLIKELY (rmdir (path) != 0)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_last_io (),
				     p_error_get_last_system (),
				     "Failed to call rmdir() to remove directory");
		return FALSE;
	} else
		return TRUE;
}